

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gil.h
# Opt level: O3

void __thiscall pybind11::gil_scoped_acquire::dec_ref(gil_scoped_acquire *this)

{
  int *piVar1;
  int iVar2;
  PyThreadState *pPVar3;
  internals *piVar4;
  
  piVar1 = &this->tstate->gilstate_counter;
  *piVar1 = *piVar1 + -1;
  pPVar3 = (PyThreadState *)_PyThreadState_UncheckedGet();
  if (pPVar3 != this->tstate) {
    pybind11_fail("scoped_acquire::dec_ref(): thread state must be current!");
  }
  iVar2 = this->tstate->gilstate_counter;
  if (-1 < iVar2) {
    if (iVar2 == 0) {
      if (this->release == false) {
        pybind11_fail("scoped_acquire::dec_ref(): internal error!");
      }
      PyThreadState_Clear();
      if (this->active == true) {
        PyThreadState_DeleteCurrent();
      }
      piVar4 = detail::get_internals();
      PyThread_tss_set(piVar4->tstate,0);
      this->release = false;
    }
    return;
  }
  pybind11_fail("scoped_acquire::dec_ref(): reference count underflow!");
}

Assistant:

PYBIND11_NOINLINE void dec_ref() {
        --tstate->gilstate_counter;
#    if defined(PYBIND11_DETAILED_ERROR_MESSAGES)
        if (detail::get_thread_state_unchecked() != tstate) {
            pybind11_fail("scoped_acquire::dec_ref(): thread state must be current!");
        }
        if (tstate->gilstate_counter < 0) {
            pybind11_fail("scoped_acquire::dec_ref(): reference count underflow!");
        }
#    endif
        if (tstate->gilstate_counter == 0) {
#    if defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            if (!release) {
                pybind11_fail("scoped_acquire::dec_ref(): internal error!");
            }
#    endif
            PyThreadState_Clear(tstate);
            if (active) {
                PyThreadState_DeleteCurrent();
            }
            PYBIND11_TLS_DELETE_VALUE(detail::get_internals().tstate);
            release = false;
        }
    }